

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceGroup * __thiscall
cmMakefile::FindSourceGroup
          (cmMakefile *this,string *source,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *groups)

{
  cmSourceGroup *pcVar1;
  cmSourceGroup *pcVar2;
  cmSourceGroup *pcVar3;
  cmSourceGroup *pcVar4;
  cmSourceGroup *unaff_RBX;
  cmSourceGroup *pcVar5;
  
  pcVar2 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    pcVar4 = pcVar2;
    pcVar1 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = unaff_RBX;
    if (pcVar4 == pcVar1) break;
    pcVar3 = cmSourceGroup::MatchChildrenFiles(pcVar4 + -1,source);
    pcVar2 = pcVar4 + -1;
  } while (pcVar3 == (cmSourceGroup *)0x0);
  if (pcVar4 == pcVar1) {
    pcVar2 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      pcVar5 = pcVar2;
      pcVar1 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = pcVar3;
      if (pcVar5 == pcVar1) break;
      pcVar4 = cmSourceGroup::MatchChildrenRegex(pcVar5 + -1,source);
      pcVar2 = pcVar5 + -1;
    } while (pcVar4 == (cmSourceGroup *)0x0);
    pcVar3 = pcVar4;
    if (pcVar5 == pcVar1) {
      pcVar3 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  return pcVar3;
}

Assistant:

cmSourceGroup* cmMakefile::FindSourceGroup(
  const std::string& source, std::vector<cmSourceGroup>& groups) const
{
  // First search for a group that lists the file explicitly.
  for (auto sg = groups.rbegin(); sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenFiles(source);
    if (result) {
      return result;
    }
  }

  // Now search for a group whose regex matches the file.
  for (auto sg = groups.rbegin(); sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenRegex(source);
    if (result) {
      return result;
    }
  }

  // Shouldn't get here, but just in case, return the default group.
  return groups.data();
}